

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

mcpl_generic_filehandle_t *
mcpl_generic_fopen(mcpl_generic_filehandle_t *__return_storage_ptr__,char *filename)

{
  mcpl_generic_fopen_try(__return_storage_ptr__,filename);
  if (__return_storage_ptr__->internal != (void *)0x0) {
    return __return_storage_ptr__;
  }
  mcpl_error("Unable to open file!");
}

Assistant:

mcpl_generic_filehandle_t mcpl_generic_fopen( const char * filename )
{
  mcpl_generic_filehandle_t res = mcpl_generic_fopen_try(filename);
  if (!res.internal)
    mcpl_error("Unable to open file!");
  return res;
}